

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O2

HeaderState __thiscall HttpData::parseHeaders(HttpData *this)

{
  string *this_00;
  char cVar1;
  ParseState PVar2;
  pointer pcVar3;
  HeaderState HVar4;
  ulong uVar5;
  mapped_type *this_01;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong __pos;
  int local_90;
  int local_8c;
  string key;
  string value;
  
  this_00 = &this->inBuffer_;
  bVar6 = true;
  uVar5 = 0;
  __pos = 0;
  local_90 = -1;
  uVar8 = 0xffffffff;
  uVar9 = 0xffffffff;
  local_8c = local_90;
  do {
    PVar2 = this->hState_;
    if (((this->inBuffer_)._M_string_length <= __pos) || (!bVar6)) {
      if (PVar2 == H_END_LF) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&key,this_00,__pos,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this_00,&key);
        std::__cxx11::string::~string((string *)&key);
        HVar4 = PARSE_HEADER_SUCCESS;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&key,this_00,(long)(int)uVar5,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this_00,&key);
        std::__cxx11::string::~string((string *)&key);
        HVar4 = PARSE_HEADER_AGAIN;
      }
      return HVar4;
    }
    bVar6 = true;
    if (PVar2 < (H_END_LF|H_KEY)) {
      iVar7 = (int)uVar8;
      iVar10 = (int)__pos;
      switch(PVar2) {
      case H_START:
        cVar1 = (this_00->_M_dataplus)._M_p[__pos];
        if ((cVar1 != '\n') && (cVar1 != '\r')) {
          this->hState_ = H_KEY;
          goto LAB_00108664;
        }
        break;
      case H_KEY:
        cVar1 = (this_00->_M_dataplus)._M_p[__pos];
        if (cVar1 == ':') {
          if (iVar10 <= (int)uVar9) {
            return PARSE_HEADER_ERROR;
          }
          this->hState_ = H_COLON;
          local_90 = iVar10;
        }
        else {
          if (cVar1 == '\n') {
            return PARSE_HEADER_ERROR;
          }
          if (cVar1 == '\r') {
            return PARSE_HEADER_ERROR;
          }
        }
        break;
      case H_COLON:
        if ((this_00->_M_dataplus)._M_p[__pos] != ' ') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_SPACES_AFTER_COLON;
        break;
      case H_SPACES_AFTER_COLON:
        this->hState_ = H_VALUE;
        uVar8 = __pos & 0xffffffff;
        break;
      case H_VALUE:
        if ((this_00->_M_dataplus)._M_p[__pos] == '\r') {
          this->hState_ = H_CR;
          local_8c = iVar10;
          if (iVar10 <= iVar7) {
            return PARSE_HEADER_ERROR;
          }
        }
        else if (0xff < __pos - (long)iVar7) {
          return PARSE_HEADER_ERROR;
        }
        break;
      case H_CR:
        pcVar3 = (this_00->_M_dataplus)._M_p;
        if (pcVar3[__pos] != '\n') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_LF;
        key._M_dataplus._M_p = (pointer)&key.field_2;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&key,pcVar3 + (int)uVar9,pcVar3 + local_90);
        pcVar3 = (this->inBuffer_)._M_dataplus._M_p;
        value._M_dataplus._M_p = (pointer)&value.field_2;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&value,pcVar3 + iVar7,pcVar3 + local_8c);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this->headers_,&key);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_01,&value);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&key);
        uVar5 = __pos & 0xffffffff;
        bVar6 = true;
        break;
      case H_LF:
        if ((this_00->_M_dataplus)._M_p[__pos] != '\r') {
          this->hState_ = H_KEY;
          goto LAB_00108685;
        }
        this->hState_ = H_END_CR;
        break;
      case H_END_CR:
        if ((this_00->_M_dataplus)._M_p[__pos] != '\n') {
          return PARSE_HEADER_ERROR;
        }
        this->hState_ = H_END_LF;
        break;
      case H_END_LF:
        bVar6 = false;
LAB_00108664:
        uVar5 = __pos & 0xffffffff;
LAB_00108685:
        uVar9 = __pos & 0xffffffff;
      }
    }
    __pos = __pos + 1;
  } while( true );
}

Assistant:

HeaderState HttpData::parseHeaders() {
  string &str = inBuffer_;
  int key_start = -1, key_end = -1, value_start = -1, value_end = -1;
  int now_read_line_begin = 0;
  bool notFinish = true;
  size_t i = 0;
  for (; i < str.size() && notFinish; ++i) {
    switch (hState_) {
      case H_START: {
        if (str[i] == '\n' || str[i] == '\r') break;
        hState_ = H_KEY;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
      case H_KEY: {
        if (str[i] == ':') {
          key_end = i;
          if (key_end - key_start <= 0) return PARSE_HEADER_ERROR;
          hState_ = H_COLON;
        } else if (str[i] == '\n' || str[i] == '\r')
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_COLON: {
        if (str[i] == ' ') {
          hState_ = H_SPACES_AFTER_COLON;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_SPACES_AFTER_COLON: {
        hState_ = H_VALUE;
        value_start = i;
        break;
      }
      case H_VALUE: {
        if (str[i] == '\r') {
          hState_ = H_CR;
          value_end = i;
          if (value_end - value_start <= 0) return PARSE_HEADER_ERROR;
        } else if (i - value_start > 255)
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_CR: {
        if (str[i] == '\n') {
          hState_ = H_LF;
          string key(str.begin() + key_start, str.begin() + key_end);
          string value(str.begin() + value_start, str.begin() + value_end);
          headers_[key] = value;
          now_read_line_begin = i;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_LF: {
        if (str[i] == '\r') {
          hState_ = H_END_CR;
        } else {
          key_start = i;
          hState_ = H_KEY;
        }
        break;
      }
      case H_END_CR: {
        if (str[i] == '\n') {
          hState_ = H_END_LF;
        } else
          return PARSE_HEADER_ERROR;
        break;
      }
      case H_END_LF: {
        notFinish = false;
        key_start = i;
        now_read_line_begin = i;
        break;
      }
    }
  }
  if (hState_ == H_END_LF) {
    str = str.substr(i);
    return PARSE_HEADER_SUCCESS;
  }
  str = str.substr(now_read_line_begin);
  return PARSE_HEADER_AGAIN;
}